

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TestCase755::run(TestCase755 *this)

{
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  undefined8 uVar4;
  long *plVar5;
  ReadableFile *pRVar6;
  undefined1 uVar7;
  char cVar8;
  byte bVar9;
  int iVar10;
  String *pSVar11;
  bool bVar12;
  StringPtr name;
  StringPtr name_00;
  PathPtr path;
  StringPtr text;
  StringPtr name_01;
  PathPtr path_00;
  ArrayPtr<const_kj::StringPtr> parts;
  StringPtr name_02;
  PathPtr path_01;
  ArrayPtr<const_kj::StringPtr> parts_00;
  PathPtr path_02;
  StringPtr name_03;
  StringPtr name_04;
  PathPtr path_03;
  StringPtr text_00;
  ArrayPtr<const_kj::StringPtr> parts_01;
  PathPtr path_04;
  ArrayPtr<const_kj::StringPtr> parts_02;
  StringPtr name_05;
  StringPtr name_06;
  PathPtr path_05;
  StringPtr text_01;
  ArrayPtr<const_kj::StringPtr> parts_03;
  ArrayPtr<const_kj::StringPtr> parts_04;
  PathPtr path_06;
  bool _kjCondition_4;
  Own<kj::Directory::Replacer<kj::Directory>,_std::nullptr_t> replacer_1;
  DebugComparison<kj::String,_const_char_(&)[9]> _kjCondition;
  bool _kjCondition_8;
  DebugExpression<bool> _kjCondition_1;
  Own<kj::Directory,_std::nullptr_t> dir;
  Own<kj::Directory::Replacer<kj::Directory>,_std::nullptr_t> replacer;
  TempDir tempDir;
  String local_168;
  Path local_148;
  undefined8 local_130;
  DebugComparison<kj::String,_const_char_(&)[9]> local_128;
  String local_e8;
  String local_c8;
  undefined1 local_a8 [24];
  long *plStack_90;
  ArrayDisposer *local_88;
  Path local_78;
  FsNode local_58;
  ReadableFile *local_50;
  TempDir local_48;
  
  TempDir::TempDir(&local_48);
  TempDir::get((TempDir *)local_a8);
  uVar4 = local_a8._8_8_;
  name.content.size_ = 4;
  name.content.ptr = "foo";
  Path::Path((Path *)&local_128,name);
  (**(code **)(((Array<char> *)uVar4)->ptr + 0x90))
            (local_a8 + 0x10,uVar4,local_128.left.content.ptr,local_128.left.content.size_,1);
  sVar2 = local_128.left.content.size_;
  pcVar1 = local_128.left.content.ptr;
  if (local_128.left.content.ptr != (char *)0x0) {
    local_128.left.content.ptr = (char *)0x0;
    local_128.left.content.size_ = 0;
    (**(local_128.left.content.disposer)->_vptr_ArrayDisposer)
              (local_128.left.content.disposer,pcVar1,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  pSVar11 = (String *)(**(code **)*plStack_90)();
  name_00.content.size_ = 4;
  name_00.content.ptr = "bar";
  Path::Path((Path *)&local_128,name_00);
  path.parts.size_ = (size_t)local_128.left.content.ptr;
  path.parts.ptr = pSVar11;
  Directory::openFile((Directory *)&local_148,path,(WriteMode)local_128.left.content.size_);
  text.content.size_ = 9;
  text.content.ptr = "original";
  File::writeAll((File *)local_148.parts.size_,text);
  sVar2 = local_148.parts.size_;
  if ((File *)local_148.parts.size_ != (File *)0x0) {
    local_148.parts.size_ = 0;
    (**(code **)((local_148.parts.ptr)->content).ptr)
              (local_148.parts.ptr,
               (((ReadableFile *)sVar2)->super_FsNode)._vptr_FsNode[-2] +
               (long)&(((ReadableFile *)sVar2)->super_FsNode)._vptr_FsNode);
  }
  sVar2 = local_128.left.content.size_;
  pcVar1 = local_128.left.content.ptr;
  if (local_128.left.content.ptr != (char *)0x0) {
    local_128.left.content.ptr = (char *)0x0;
    local_128.left.content.size_ = 0;
    (**(local_128.left.content.disposer)->_vptr_ArrayDisposer)
              (local_128.left.content.disposer,pcVar1,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  pSVar11 = (String *)(**(code **)*plStack_90)();
  name_01.content.size_ = 4;
  name_01.content.ptr = "bar";
  Path::Path((Path *)&local_168,name_01);
  path_00.parts.size_ = (size_t)local_168.content.ptr;
  path_00.parts.ptr = pSVar11;
  ReadableDirectory::openFile((ReadableDirectory *)&local_e8,path_00);
  ReadableFile::readAllText(&local_c8,(ReadableFile *)local_e8.content.size_);
  local_148.parts.ptr = (String *)local_c8.content.ptr;
  local_148.parts.size_ = local_c8.content.size_;
  local_148.parts.disposer = local_c8.content.disposer;
  local_c8.content.ptr = (char *)0x0;
  local_c8.content.size_ = 0;
  kj::_::DebugExpression<kj::String>::operator==
            (&local_128,(DebugExpression<kj::String> *)&local_148,(char (*) [9])"original");
  sVar2 = local_148.parts.size_;
  pSVar11 = local_148.parts.ptr;
  if (local_148.parts.ptr != (String *)0x0) {
    local_148.parts.ptr = (String *)0x0;
    local_148.parts.size_ = 0;
    (**(local_148.parts.disposer)->_vptr_ArrayDisposer)
              (local_148.parts.disposer,pSVar11,1,sVar2,sVar2,0);
  }
  sVar2 = local_c8.content.size_;
  pcVar1 = local_c8.content.ptr;
  if (local_c8.content.ptr != (char *)0x0) {
    local_c8.content.ptr = (char *)0x0;
    local_c8.content.size_ = 0;
    (**(local_c8.content.disposer)->_vptr_ArrayDisposer)
              (local_c8.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  sVar2 = local_e8.content.size_;
  if ((ReadableFile *)local_e8.content.size_ != (ReadableFile *)0x0) {
    local_e8.content.size_ = 0;
    (*(code *)**(undefined8 **)local_e8.content.ptr)
              (local_e8.content.ptr,((FsNode *)sVar2)->_vptr_FsNode[-2] + (long)(FsNode *)sVar2);
  }
  sVar2 = local_168.content.size_;
  pcVar1 = local_168.content.ptr;
  if (local_168.content.ptr != (char *)0x0) {
    local_168.content.ptr = (char *)0x0;
    local_168.content.size_ = 0;
    (**(local_168.content.disposer)->_vptr_ArrayDisposer)
              (local_168.content.disposer,pcVar1,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  if ((local_128.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[84],kj::_::DebugComparison<kj::String,char_const(&)[9]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
               ,0x2fa,ERROR,
               "\"failed: expected \" \"replacer->get().openFile(Path(\\\"bar\\\"))->readAllText() == \\\"original\\\"\", _kjCondition"
               ,(char (*) [84])
                "failed: expected replacer->get().openFile(Path(\"bar\"))->readAllText() == \"original\""
               ,&local_128);
  }
  sVar2 = local_128.left.content.size_;
  pcVar1 = local_128.left.content.ptr;
  if (local_128.left.content.ptr != (char *)0x0) {
    local_128.left.content.ptr = (char *)0x0;
    local_128.left.content.size_ = 0;
    (**(local_128.left.content.disposer)->_vptr_ArrayDisposer)
              (local_128.left.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  uVar4 = local_a8._8_8_;
  local_128.left.content.ptr = "foo";
  local_128.left.content.size_ = 4;
  local_128.left.content.disposer = (ArrayDisposer *)0x4d67ef;
  local_128.right = (char (*) [9])&DAT_00000004;
  parts.size_ = 2;
  parts.ptr = (StringPtr *)&local_128;
  Path::Path(&local_148,parts);
  uVar7 = (**(code **)(((Array<char> *)uVar4)->ptr + 0x40))
                    (uVar4,local_148.parts.ptr,local_148.parts.size_);
  sVar2 = local_148.parts.size_;
  pSVar11 = local_148.parts.ptr;
  local_c8.content.ptr = (char *)(CONCAT71(local_c8.content.ptr._1_7_,uVar7) ^ 1);
  if (local_148.parts.ptr != (String *)0x0) {
    local_148.parts.ptr = (String *)0x0;
    local_148.parts.size_ = 0;
    (**(local_148.parts.disposer)->_vptr_ArrayDisposer)
              (local_148.parts.disposer,pSVar11,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  if (((char)local_c8.content.ptr == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[52],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
               ,0x2fb,ERROR,
               "\"failed: expected \" \"!dir->exists(Path({\\\"foo\\\", \\\"bar\\\"}))\", _kjCondition"
               ,(char (*) [52])"failed: expected !dir->exists(Path({\"foo\", \"bar\"}))",
               (DebugExpression<bool> *)&local_c8);
  }
  plVar5 = plStack_90;
  cVar8 = (**(code **)(*plStack_90 + 8))(plStack_90);
  if (cVar8 == '\0') {
    Directory::commitFailed(*(WriteMode *)(plVar5 + 1));
  }
  pSVar11 = (String *)(**(code **)*plStack_90)();
  name_02.content.size_ = 4;
  name_02.content.ptr = "bar";
  Path::Path((Path *)&local_168,name_02);
  path_01.parts.size_ = (size_t)local_168.content.ptr;
  path_01.parts.ptr = pSVar11;
  ReadableDirectory::openFile((ReadableDirectory *)&local_e8,path_01);
  ReadableFile::readAllText(&local_c8,(ReadableFile *)local_e8.content.size_);
  local_148.parts.ptr = (String *)local_c8.content.ptr;
  local_148.parts.size_ = local_c8.content.size_;
  local_148.parts.disposer = local_c8.content.disposer;
  local_c8.content.ptr = (char *)0x0;
  local_c8.content.size_ = 0;
  kj::_::DebugExpression<kj::String>::operator==
            (&local_128,(DebugExpression<kj::String> *)&local_148,(char (*) [9])"original");
  sVar2 = local_148.parts.size_;
  pSVar11 = local_148.parts.ptr;
  if (local_148.parts.ptr != (String *)0x0) {
    local_148.parts.ptr = (String *)0x0;
    local_148.parts.size_ = 0;
    (**(local_148.parts.disposer)->_vptr_ArrayDisposer)
              (local_148.parts.disposer,pSVar11,1,sVar2,sVar2,0);
  }
  sVar2 = local_c8.content.size_;
  pcVar1 = local_c8.content.ptr;
  if (local_c8.content.ptr != (char *)0x0) {
    local_c8.content.ptr = (char *)0x0;
    local_c8.content.size_ = 0;
    (**(local_c8.content.disposer)->_vptr_ArrayDisposer)
              (local_c8.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  sVar2 = local_e8.content.size_;
  if ((ReadableFile *)local_e8.content.size_ != (ReadableFile *)0x0) {
    local_e8.content.size_ = 0;
    (*(code *)**(undefined8 **)local_e8.content.ptr)
              (local_e8.content.ptr,
               ((FsNode *)&((FsNode *)sVar2)->_vptr_FsNode)->_vptr_FsNode[-2] +
               (long)(FsNode *)sVar2);
  }
  sVar2 = local_168.content.size_;
  pcVar1 = local_168.content.ptr;
  if (local_168.content.ptr != (char *)0x0) {
    local_168.content.ptr = (char *)0x0;
    local_168.content.size_ = 0;
    (**(local_168.content.disposer)->_vptr_ArrayDisposer)
              (local_168.content.disposer,pcVar1,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  if ((local_128.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[84],kj::_::DebugComparison<kj::String,char_const(&)[9]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
               ,0x2fe,ERROR,
               "\"failed: expected \" \"replacer->get().openFile(Path(\\\"bar\\\"))->readAllText() == \\\"original\\\"\", _kjCondition"
               ,(char (*) [84])
                "failed: expected replacer->get().openFile(Path(\"bar\"))->readAllText() == \"original\""
               ,&local_128);
  }
  sVar2 = local_128.left.content.size_;
  pcVar1 = local_128.left.content.ptr;
  if (local_128.left.content.ptr != (char *)0x0) {
    local_128.left.content.ptr = (char *)0x0;
    local_128.left.content.size_ = 0;
    (**(local_128.left.content.disposer)->_vptr_ArrayDisposer)
              (local_128.left.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  uVar4 = local_a8._8_8_;
  local_148.parts.ptr = (String *)0x4f8544;
  local_148.parts.size_ = (size_t)&DAT_00000004;
  local_148.parts.disposer = (ArrayDisposer *)0x4d67ef;
  local_130 = 4;
  parts_00.size_ = 2;
  parts_00.ptr = (StringPtr *)&local_148;
  Path::Path((Path *)&local_e8,parts_00);
  path_02.parts.size_ = (size_t)local_e8.content.ptr;
  path_02.parts.ptr = (String *)uVar4;
  ReadableDirectory::openFile((ReadableDirectory *)&local_78,path_02);
  ReadableFile::readAllText(&local_168,(ReadableFile *)local_78.parts.size_);
  local_c8.content.ptr = local_168.content.ptr;
  local_c8.content.size_ = local_168.content.size_;
  local_c8.content.disposer = local_168.content.disposer;
  local_168.content.ptr = (char *)0x0;
  local_168.content.size_ = 0;
  kj::_::DebugExpression<kj::String>::operator==
            (&local_128,(DebugExpression<kj::String> *)&local_c8,(char (*) [9])"original");
  sVar2 = local_c8.content.size_;
  pcVar1 = local_c8.content.ptr;
  if (local_c8.content.ptr != (char *)0x0) {
    local_c8.content.ptr = (char *)0x0;
    local_c8.content.size_ = 0;
    (**(local_c8.content.disposer)->_vptr_ArrayDisposer)
              (local_c8.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  sVar2 = local_168.content.size_;
  pcVar1 = local_168.content.ptr;
  if (local_168.content.ptr != (char *)0x0) {
    local_168.content.ptr = (char *)0x0;
    local_168.content.size_ = 0;
    (**(local_168.content.disposer)->_vptr_ArrayDisposer)
              (local_168.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  sVar2 = local_78.parts.size_;
  if ((ReadableFile *)local_78.parts.size_ != (ReadableFile *)0x0) {
    local_78.parts.size_ = 0;
    (**(code **)((local_78.parts.ptr)->content).ptr)
              (local_78.parts.ptr,((FsNode *)sVar2)->_vptr_FsNode[-2] + (long)(FsNode *)sVar2);
  }
  sVar2 = local_e8.content.size_;
  pcVar1 = local_e8.content.ptr;
  if (local_e8.content.ptr != (char *)0x0) {
    local_e8.content.ptr = (char *)0x0;
    local_e8.content.size_ = 0;
    (**(local_e8.content.disposer)->_vptr_ArrayDisposer)
              (local_e8.content.disposer,pcVar1,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  if ((local_128.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[82],kj::_::DebugComparison<kj::String,char_const(&)[9]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
               ,0x2ff,ERROR,
               "\"failed: expected \" \"dir->openFile(Path({\\\"foo\\\", \\\"bar\\\"}))->readAllText() == \\\"original\\\"\", _kjCondition"
               ,(char (*) [82])
                "failed: expected dir->openFile(Path({\"foo\", \"bar\"}))->readAllText() == \"original\""
               ,&local_128);
  }
  sVar2 = local_128.left.content.size_;
  pcVar1 = local_128.left.content.ptr;
  if (local_128.left.content.ptr != (char *)0x0) {
    local_128.left.content.ptr = (char *)0x0;
    local_128.left.content.size_ = 0;
    (**(local_128.left.content.disposer)->_vptr_ArrayDisposer)
              (local_128.left.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  plVar5 = plStack_90;
  if (plStack_90 != (long *)0x0) {
    plStack_90 = (long *)0x0;
    (***(_func_int ***)local_a8._16_8_)(local_a8._16_8_,(long)plVar5 + *(long *)(*plVar5 + -0x10));
  }
  uVar4 = local_a8._8_8_;
  name_03.content.size_ = 4;
  name_03.content.ptr = "foo";
  Path::Path((Path *)&local_128,name_03);
  (**(code **)(((Array<char> *)uVar4)->ptr + 0x90))
            (&local_148,uVar4,local_128.left.content.ptr,local_128.left.content.size_,1);
  sVar2 = local_128.left.content.size_;
  pcVar1 = local_128.left.content.ptr;
  if (local_128.left.content.ptr != (char *)0x0) {
    local_128.left.content.ptr = (char *)0x0;
    local_128.left.content.size_ = 0;
    (**(local_128.left.content.disposer)->_vptr_ArrayDisposer)
              (local_128.left.content.disposer,pcVar1,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  pSVar11 = (String *)(*(code *)**(undefined8 **)local_148.parts.size_)();
  name_04.content.size_ = 6;
  name_04.content.ptr = "corge";
  Path::Path((Path *)&local_128,name_04);
  path_03.parts.size_ = (size_t)local_128.left.content.ptr;
  path_03.parts.ptr = pSVar11;
  Directory::openFile((Directory *)&local_c8,path_03,(WriteMode)local_128.left.content.size_);
  text_00.content.size_ = 7;
  text_00.content.ptr = "bazqux";
  File::writeAll((File *)local_c8.content.size_,text_00);
  sVar2 = local_c8.content.size_;
  if ((File *)local_c8.content.size_ != (File *)0x0) {
    local_c8.content.size_ = 0;
    (*(code *)**(undefined8 **)local_c8.content.ptr)
              (local_c8.content.ptr,
               (((ReadableFile *)sVar2)->super_FsNode)._vptr_FsNode[-2] +
               (long)&(((ReadableFile *)sVar2)->super_FsNode)._vptr_FsNode);
  }
  sVar2 = local_128.left.content.size_;
  pcVar1 = local_128.left.content.ptr;
  if (local_128.left.content.ptr != (char *)0x0) {
    local_128.left.content.ptr = (char *)0x0;
    local_128.left.content.size_ = 0;
    (**(local_128.left.content.disposer)->_vptr_ArrayDisposer)
              (local_128.left.content.disposer,pcVar1,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  (**(code **)(((Array<char> *)local_a8._8_8_)->ptr + 0x30))(&local_128);
  sVar2 = local_128.left.content.size_;
  if (local_128.left.content.size_ == 1) {
    (**(code **)(((Array<char> *)local_a8._8_8_)->ptr + 0x30))(&local_c8);
    if (*(undefined1 **)(local_c8.content.ptr + 8) != &DAT_00000004) goto LAB_002cd929;
    iVar10 = bcmp(*(void **)local_c8.content.ptr,"foo",4);
    bVar12 = iVar10 == 0;
  }
  else {
LAB_002cd929:
    bVar12 = false;
  }
  sVar3 = local_c8.content.size_;
  pcVar1 = local_c8.content.ptr;
  if ((sVar2 == 1) && (local_c8.content.ptr != (char *)0x0)) {
    local_c8.content.ptr = (char *)0x0;
    local_c8.content.size_ = 0;
    (**(local_c8.content.disposer)->_vptr_ArrayDisposer)
              (local_c8.content.disposer,pcVar1,0x18,sVar3,sVar3,
               ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  sVar2 = local_128.left.content.size_;
  pcVar1 = local_128.left.content.ptr;
  if (local_128.left.content.ptr != (char *)0x0) {
    local_128.left.content.ptr = (char *)0x0;
    local_128.left.content.size_ = 0;
    (**(local_128.left.content.disposer)->_vptr_ArrayDisposer)
              (local_128.left.content.disposer,pcVar1,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  local_168.content.ptr = (char *)CONCAT71(local_168.content.ptr._1_7_,bVar12);
  if (kj::_::Debug::minSeverity < 3 && bVar12 == false) {
    kj::_::Debug::log<char_const(&)[78],bool&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
               ,0x306,ERROR,
               "\"failed: expected \" \"dir->listNames().size() == 1 && dir->listNames()[0] == \\\"foo\\\"\", _kjCondition"
               ,(char (*) [78])
                "failed: expected dir->listNames().size() == 1 && dir->listNames()[0] == \"foo\"",
               (bool *)&local_168);
  }
  bVar9 = (**(code **)(*(long *)local_148.parts.size_ + 8))();
  local_128.left.content.ptr = (char *)(CONCAT71(local_128.left.content.ptr._1_7_,bVar9) ^ 1);
  if ((bVar9 & kj::_::Debug::minSeverity < 3) != 0) {
    kj::_::Debug::log<char_const(&)[40],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
               ,0x307,ERROR,"\"failed: expected \" \"!replacer->tryCommit()\", _kjCondition",
               (char (*) [40])"failed: expected !replacer->tryCommit()",
               (DebugExpression<bool> *)&local_128);
  }
  sVar2 = local_148.parts.size_;
  if ((long *)local_148.parts.size_ != (long *)0x0) {
    local_148.parts.size_ = 0;
    (**(code **)((local_148.parts.ptr)->content).ptr)
              (local_148.parts.ptr,(undefined1 *)(sVar2 + *(long *)(*(long *)sVar2 + -0x10)));
  }
  uVar4 = local_a8._8_8_;
  local_148.parts.ptr = (String *)0x4f8544;
  local_148.parts.size_ = (size_t)&DAT_00000004;
  local_148.parts.disposer = (ArrayDisposer *)0x4d67ef;
  local_130 = 4;
  parts_01.size_ = 2;
  parts_01.ptr = (StringPtr *)&local_148;
  Path::Path((Path *)(local_a8 + 0x10),parts_01);
  path_04.parts.size_ = local_a8._16_8_;
  path_04.parts.ptr = (String *)uVar4;
  ReadableDirectory::openFile((ReadableDirectory *)&local_78,path_04);
  ReadableFile::readAllText(&local_e8,(ReadableFile *)local_78.parts.size_);
  local_168.content.ptr = local_e8.content.ptr;
  local_168.content.size_ = local_e8.content.size_;
  local_168.content.disposer = local_e8.content.disposer;
  local_e8.content.ptr = (char *)0x0;
  local_e8.content.size_ = 0;
  kj::_::DebugExpression<kj::String>::operator==
            (&local_128,(DebugExpression<kj::String> *)&local_168,(char (*) [9])"original");
  sVar2 = local_168.content.size_;
  pcVar1 = local_168.content.ptr;
  if (local_168.content.ptr != (char *)0x0) {
    local_168.content.ptr = (char *)0x0;
    local_168.content.size_ = 0;
    (**(local_168.content.disposer)->_vptr_ArrayDisposer)
              (local_168.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  sVar2 = local_e8.content.size_;
  pcVar1 = local_e8.content.ptr;
  if (local_e8.content.ptr != (char *)0x0) {
    local_e8.content.ptr = (char *)0x0;
    local_e8.content.size_ = 0;
    (**(local_e8.content.disposer)->_vptr_ArrayDisposer)
              (local_e8.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  sVar2 = local_78.parts.size_;
  if ((ReadableFile *)local_78.parts.size_ != (ReadableFile *)0x0) {
    local_78.parts.size_ = 0;
    (**(code **)((local_78.parts.ptr)->content).ptr)
              (local_78.parts.ptr,((FsNode *)sVar2)->_vptr_FsNode[-2] + (long)(FsNode *)sVar2);
  }
  plVar5 = plStack_90;
  uVar4 = local_a8._16_8_;
  if ((ArrayDisposer *)local_a8._16_8_ != (ArrayDisposer *)0x0) {
    local_a8._16_8_ = (ArrayDisposer *)0x0;
    plStack_90 = (long *)0x0;
    (**local_88->_vptr_ArrayDisposer)
              (local_88,uVar4,0x18,plVar5,plVar5,ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  if ((local_128.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[82],kj::_::DebugComparison<kj::String,char_const(&)[9]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
               ,0x30b,ERROR,
               "\"failed: expected \" \"dir->openFile(Path({\\\"foo\\\", \\\"bar\\\"}))->readAllText() == \\\"original\\\"\", _kjCondition"
               ,(char (*) [82])
                "failed: expected dir->openFile(Path({\"foo\", \"bar\"}))->readAllText() == \"original\""
               ,&local_128);
  }
  sVar2 = local_128.left.content.size_;
  pcVar1 = local_128.left.content.ptr;
  if (local_128.left.content.ptr != (char *)0x0) {
    local_128.left.content.ptr = (char *)0x0;
    local_128.left.content.size_ = 0;
    (**(local_128.left.content.disposer)->_vptr_ArrayDisposer)
              (local_128.left.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  uVar4 = local_a8._8_8_;
  local_128.left.content.ptr = "foo";
  local_128.left.content.size_ = 4;
  local_128.left.content.disposer = (ArrayDisposer *)0x4d68c5;
  local_128.right = (char (*) [9])&DAT_00000006;
  parts_02.size_ = 2;
  parts_02.ptr = (StringPtr *)&local_128;
  Path::Path(&local_148,parts_02);
  uVar7 = (**(code **)(((Array<char> *)uVar4)->ptr + 0x40))
                    (uVar4,local_148.parts.ptr,local_148.parts.size_);
  sVar2 = local_148.parts.size_;
  pSVar11 = local_148.parts.ptr;
  local_168.content.ptr = (char *)(CONCAT71(local_168.content.ptr._1_7_,uVar7) ^ 1);
  if (local_148.parts.ptr != (String *)0x0) {
    local_148.parts.ptr = (String *)0x0;
    local_148.parts.size_ = 0;
    (**(local_148.parts.disposer)->_vptr_ArrayDisposer)
              (local_148.parts.disposer,pSVar11,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  if (((char)local_168.content.ptr == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[54],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
               ,0x30c,ERROR,
               "\"failed: expected \" \"!dir->exists(Path({\\\"foo\\\", \\\"corge\\\"}))\", _kjCondition"
               ,(char (*) [54])"failed: expected !dir->exists(Path({\"foo\", \"corge\"}))",
               (DebugExpression<bool> *)&local_168);
  }
  uVar4 = local_a8._8_8_;
  name_05.content.size_ = 4;
  name_05.content.ptr = "foo";
  Path::Path((Path *)&local_128,name_05);
  (**(code **)(((Array<char> *)uVar4)->ptr + 0x90))
            (&local_148,uVar4,local_128.left.content.ptr,local_128.left.content.size_,2);
  sVar2 = local_128.left.content.size_;
  pcVar1 = local_128.left.content.ptr;
  if (local_128.left.content.ptr != (char *)0x0) {
    local_128.left.content.ptr = (char *)0x0;
    local_128.left.content.size_ = 0;
    (**(local_128.left.content.disposer)->_vptr_ArrayDisposer)
              (local_128.left.content.disposer,pcVar1,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  pSVar11 = (String *)(*(code *)**(undefined8 **)local_148.parts.size_)();
  name_06.content.size_ = 6;
  name_06.content.ptr = "corge";
  Path::Path((Path *)&local_128,name_06);
  path_05.parts.size_ = (size_t)local_128.left.content.ptr;
  path_05.parts.ptr = pSVar11;
  Directory::openFile((Directory *)&local_168,path_05,(WriteMode)local_128.left.content.size_);
  text_01.content.size_ = 7;
  text_01.content.ptr = "bazqux";
  File::writeAll((File *)local_168.content.size_,text_01);
  sVar2 = local_168.content.size_;
  if ((ReadableFile *)local_168.content.size_ != (ReadableFile *)0x0) {
    local_168.content.size_ = 0;
    (*(code *)**(undefined8 **)local_168.content.ptr)
              (local_168.content.ptr,
               ((FsNode *)&((FsNode *)sVar2)->_vptr_FsNode)->_vptr_FsNode[-2] +
               (long)&((FsNode *)sVar2)->_vptr_FsNode);
  }
  sVar2 = local_128.left.content.size_;
  pcVar1 = local_128.left.content.ptr;
  if (local_128.left.content.ptr != (char *)0x0) {
    local_128.left.content.ptr = (char *)0x0;
    local_128.left.content.size_ = 0;
    (**(local_128.left.content.disposer)->_vptr_ArrayDisposer)
              (local_128.left.content.disposer,pcVar1,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  (**(code **)(((Array<char> *)local_a8._8_8_)->ptr + 0x30))(&local_128);
  sVar2 = local_128.left.content.size_;
  if (local_128.left.content.size_ == 1) {
    (**(code **)(((Array<char> *)local_a8._8_8_)->ptr + 0x30))(&local_168);
    if (*(long *)(local_168.content.ptr + 8) == 4) {
      iVar10 = bcmp(*(void **)local_168.content.ptr,"foo",4);
      bVar12 = iVar10 == 0;
      goto LAB_002cde30;
    }
  }
  bVar12 = false;
LAB_002cde30:
  sVar3 = local_168.content.size_;
  pcVar1 = local_168.content.ptr;
  if ((sVar2 == 1) && (local_168.content.ptr != (char *)0x0)) {
    local_168.content.ptr = (char *)0x0;
    local_168.content.size_ = 0;
    (**(local_168.content.disposer)->_vptr_ArrayDisposer)
              (local_168.content.disposer,pcVar1,0x18,sVar3,sVar3,
               ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  sVar2 = local_128.left.content.size_;
  pcVar1 = local_128.left.content.ptr;
  if (local_128.left.content.ptr != (char *)0x0) {
    local_128.left.content.ptr = (char *)0x0;
    local_128.left.content.size_ = 0;
    (**(local_128.left.content.disposer)->_vptr_ArrayDisposer)
              (local_128.left.content.disposer,pcVar1,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  local_e8.content.ptr = (char *)CONCAT71(local_e8.content.ptr._1_7_,bVar12);
  if (kj::_::Debug::minSeverity < 3 && bVar12 == false) {
    kj::_::Debug::log<char_const(&)[78],bool&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
               ,0x312,ERROR,
               "\"failed: expected \" \"dir->listNames().size() == 1 && dir->listNames()[0] == \\\"foo\\\"\", _kjCondition"
               ,(char (*) [78])
                "failed: expected dir->listNames().size() == 1 && dir->listNames()[0] == \"foo\"",
               (bool *)&local_e8);
  }
  sVar2 = local_148.parts.size_;
  cVar8 = (**(code **)(*(long *)local_148.parts.size_ + 8))(local_148.parts.size_);
  if (cVar8 == '\0') {
    Directory::commitFailed(*(WriteMode *)(sVar2 + 8));
  }
  sVar2 = local_148.parts.size_;
  if ((long *)local_148.parts.size_ != (long *)0x0) {
    local_148.parts.size_ = 0;
    (**(code **)((local_148.parts.ptr)->content).ptr)
              (local_148.parts.ptr,(undefined1 *)(sVar2 + *(long *)(*(long *)sVar2 + -0x10)));
  }
  uVar4 = local_a8._8_8_;
  local_128.left.content.ptr = "foo";
  local_128.left.content.size_ = 4;
  local_128.left.content.disposer = (ArrayDisposer *)0x4d67ef;
  local_128.right = (char (*) [9])&DAT_00000004;
  parts_03.size_ = 2;
  parts_03.ptr = (StringPtr *)&local_128;
  Path::Path(&local_148,parts_03);
  uVar7 = (**(code **)(((Array<char> *)uVar4)->ptr + 0x40))
                    (uVar4,local_148.parts.ptr,local_148.parts.size_);
  sVar2 = local_148.parts.size_;
  pSVar11 = local_148.parts.ptr;
  local_e8.content.ptr = (char *)(CONCAT71(local_e8.content.ptr._1_7_,uVar7) ^ 1);
  if (local_148.parts.ptr != (String *)0x0) {
    local_148.parts.ptr = (String *)0x0;
    local_148.parts.size_ = 0;
    (**(local_148.parts.disposer)->_vptr_ArrayDisposer)
              (local_148.parts.disposer,pSVar11,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  if (((char)local_e8.content.ptr == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[52],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
               ,0x317,ERROR,
               "\"failed: expected \" \"!dir->exists(Path({\\\"foo\\\", \\\"bar\\\"}))\", _kjCondition"
               ,(char (*) [52])"failed: expected !dir->exists(Path({\"foo\", \"bar\"}))",
               (DebugExpression<bool> *)&local_e8);
  }
  uVar4 = local_a8._8_8_;
  local_148.parts.ptr = (String *)0x4f8544;
  local_148.parts.size_ = 4;
  local_148.parts.disposer = (ArrayDisposer *)0x4d68c5;
  local_130 = 6;
  parts_04.size_ = 2;
  parts_04.ptr = (StringPtr *)&local_148;
  Path::Path(&local_78,parts_04);
  path_06.parts.size_ = (size_t)local_78.parts.ptr;
  path_06.parts.ptr = (String *)uVar4;
  ReadableDirectory::openFile((ReadableDirectory *)&local_58,path_06);
  ReadableFile::readAllText((String *)(local_a8 + 0x10),local_50);
  local_e8.content.ptr = (char *)local_a8._16_8_;
  local_e8.content.size_ = (size_t)plStack_90;
  local_e8.content.disposer = local_88;
  local_a8._16_8_ = (ArrayDisposer *)0x0;
  plStack_90 = (long *)0x0;
  kj::_::DebugExpression<kj::String>::operator==
            ((DebugComparison<kj::String,_const_char_(&)[7]> *)&local_128,
             (DebugExpression<kj::String> *)&local_e8,(char (*) [7])"bazqux");
  sVar2 = local_e8.content.size_;
  pcVar1 = local_e8.content.ptr;
  if ((ArrayDisposer *)local_e8.content.ptr != (ArrayDisposer *)0x0) {
    local_e8.content.ptr = (char *)0x0;
    local_e8.content.size_ = 0;
    (**(local_e8.content.disposer)->_vptr_ArrayDisposer)
              (local_e8.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  plVar5 = plStack_90;
  uVar4 = local_a8._16_8_;
  if ((ArrayDisposer *)local_a8._16_8_ != (ArrayDisposer *)0x0) {
    local_a8._16_8_ = (ArrayDisposer *)0x0;
    plStack_90 = (long *)0x0;
    (**local_88->_vptr_ArrayDisposer)(local_88,uVar4,1,plVar5,plVar5,0);
  }
  pRVar6 = local_50;
  if (local_50 != (ReadableFile *)0x0) {
    local_50 = (ReadableFile *)0x0;
    (**(code **)*local_58._vptr_FsNode)
              (local_58._vptr_FsNode,
               (pRVar6->super_FsNode)._vptr_FsNode[-2] + (long)&pRVar6->super_FsNode);
  }
  sVar2 = local_78.parts.size_;
  pSVar11 = local_78.parts.ptr;
  if (local_78.parts.ptr != (String *)0x0) {
    local_78.parts.ptr = (String *)0x0;
    local_78.parts.size_ = 0;
    (**(local_78.parts.disposer)->_vptr_ArrayDisposer)
              (local_78.parts.disposer,pSVar11,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  if ((local_128.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[82],kj::_::DebugComparison<kj::String,char_const(&)[7]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
               ,0x318,ERROR,
               "\"failed: expected \" \"dir->openFile(Path({\\\"foo\\\", \\\"corge\\\"}))->readAllText() == \\\"bazqux\\\"\", _kjCondition"
               ,(char (*) [82])
                "failed: expected dir->openFile(Path({\"foo\", \"corge\"}))->readAllText() == \"bazqux\""
               ,(DebugComparison<kj::String,_const_char_(&)[7]> *)&local_128);
  }
  sVar2 = local_128.left.content.size_;
  pcVar1 = local_128.left.content.ptr;
  if (local_128.left.content.ptr != (char *)0x0) {
    local_128.left.content.ptr = (char *)0x0;
    local_128.left.content.size_ = 0;
    (**(local_128.left.content.disposer)->_vptr_ArrayDisposer)
              (local_128.left.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  uVar4 = local_a8._8_8_;
  if ((String *)local_a8._8_8_ != (String *)0x0) {
    local_a8._8_8_ = (String *)0x0;
    (*(code *)**(undefined8 **)local_a8._0_8_)
              (local_a8._0_8_,
               (long)&((Array<char> *)uVar4)->ptr + *(long *)(((Array<char> *)uVar4)->ptr + -0x10));
  }
  TempDir::~TempDir(&local_48);
  return;
}

Assistant:

void tick() {
    time += 1 * SECONDS;
  }